

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void scalar_cmov_test(void)

{
  int iVar1;
  secp256k1_scalar a;
  secp256k1_scalar r;
  uint64_t local_40 [8];
  
  local_40[4] = 0xbfd25e8cd0364140;
  local_40[5] = 0xbaaedce6af48a03b;
  local_40[6] = 0xfffffffffffffffe;
  local_40[7] = 0xffffffffffffffff;
  memset(local_40,0,0x20);
  secp256k1_scalar_cmov((secp256k1_scalar *)a.d[3],(secp256k1_scalar *)a.d[2],a.d[1]._4_4_);
  iVar1 = secp256k1_memcmp_var(local_40 + 4,&scalar_cmov_test::max,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1d8b,"test condition failed: secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0");
    abort();
  }
  local_40[4] = 0;
  local_40[5] = 0;
  local_40[6] = 0;
  local_40[7] = 0;
  local_40[0] = 0xbfd25e8cd0364140;
  local_40[1] = 0xbaaedce6af48a03b;
  local_40[2] = 0xfffffffffffffffe;
  local_40[3] = 0xffffffffffffffff;
  secp256k1_scalar_cmov((secp256k1_scalar *)a.d[3],(secp256k1_scalar *)a.d[2],a.d[1]._4_4_);
  iVar1 = secp256k1_memcmp_var(local_40 + 4,&scalar_cmov_test::max,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1d8f,"test condition failed: secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0");
    abort();
  }
  local_40[0] = 0;
  local_40[1] = 0;
  local_40[2] = 0;
  local_40[3] = 0;
  secp256k1_scalar_cmov((secp256k1_scalar *)a.d[3],(secp256k1_scalar *)a.d[2],a.d[1]._4_4_);
  iVar1 = secp256k1_memcmp_var(local_40 + 4,&secp256k1_scalar_zero,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1d93,
            "test condition failed: secp256k1_memcmp_var(&r, &secp256k1_scalar_zero, sizeof(r)) == 0"
           );
    abort();
  }
  local_40[0] = 1;
  local_40[1] = 0;
  local_40[2] = 0;
  local_40[3] = 0;
  secp256k1_scalar_cmov((secp256k1_scalar *)a.d[3],(secp256k1_scalar *)a.d[2],a.d[1]._4_4_);
  iVar1 = secp256k1_memcmp_var(local_40 + 4,&secp256k1_scalar_one,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1d97,
            "test condition failed: secp256k1_memcmp_var(&r, &secp256k1_scalar_one, sizeof(r)) == 0"
           );
    abort();
  }
  local_40[4] = 1;
  local_40[5] = 0;
  local_40[6] = 0;
  local_40[7] = 0;
  local_40[0] = 0;
  local_40[1] = 0;
  local_40[2] = 0;
  local_40[3] = 0;
  secp256k1_scalar_cmov((secp256k1_scalar *)a.d[3],(secp256k1_scalar *)a.d[2],a.d[1]._4_4_);
  iVar1 = secp256k1_memcmp_var(local_40 + 4,&secp256k1_scalar_one,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1d9b,
            "test condition failed: secp256k1_memcmp_var(&r, &secp256k1_scalar_one, sizeof(r)) == 0"
           );
    abort();
  }
  return;
}

Assistant:

static void scalar_cmov_test(void) {
    static const secp256k1_scalar max = SECP256K1_SCALAR_CONST(
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFEUL,
        0xBAAEDCE6UL, 0xAF48A03BUL, 0xBFD25E8CUL, 0xD0364140UL
    );
    secp256k1_scalar r = max;
    secp256k1_scalar a = secp256k1_scalar_zero;

    secp256k1_scalar_cmov(&r, &a, 0);
    CHECK(secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0);

    r = secp256k1_scalar_zero; a = max;
    secp256k1_scalar_cmov(&r, &a, 1);
    CHECK(secp256k1_memcmp_var(&r, &max, sizeof(r)) == 0);

    a = secp256k1_scalar_zero;
    secp256k1_scalar_cmov(&r, &a, 1);
    CHECK(secp256k1_memcmp_var(&r, &secp256k1_scalar_zero, sizeof(r)) == 0);

    a = secp256k1_scalar_one;
    secp256k1_scalar_cmov(&r, &a, 1);
    CHECK(secp256k1_memcmp_var(&r, &secp256k1_scalar_one, sizeof(r)) == 0);

    r = secp256k1_scalar_one; a = secp256k1_scalar_zero;
    secp256k1_scalar_cmov(&r, &a, 0);
    CHECK(secp256k1_memcmp_var(&r, &secp256k1_scalar_one, sizeof(r)) == 0);
}